

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes.c
# Opt level: O2

int CVodeComputeStateSens(void *cvode_mem,N_Vector *ycorS,N_Vector *yS)

{
  int iVar1;
  int iVar2;
  
  if (cvode_mem == (void *)0x0) {
    iVar2 = -0x15;
    cvProcessError((CVodeMem)0x0,-0x15,0xe5b,"CVodeComputeStateSens",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                   ,"cvode_mem = NULL illegal.");
  }
  else {
    iVar1 = N_VLinearSumVectorArray
                      (0x3ff0000000000000,0,*(undefined4 *)((long)cvode_mem + 0x90),
                       *(undefined8 *)((long)cvode_mem + 0x288),ycorS,yS);
    iVar2 = -0x1c;
    if (iVar1 == 0) {
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int CVodeComputeStateSens(void* cvode_mem, N_Vector* ycorS, N_Vector* yS)
{
  int retval;
  CVodeMem cv_mem;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }

  cv_mem = (CVodeMem)cvode_mem;

  SUNDIALS_MARK_FUNCTION_BEGIN(CV_PROFILER);

  retval = N_VLinearSumVectorArray(cv_mem->cv_Ns, ONE, cv_mem->cv_znS[0], ONE,
                                   ycorS, yS);
  if (retval != CV_SUCCESS)
  {
    SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
    return (CV_VECTOROP_ERR);
  }

  SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
  return (CV_SUCCESS);
}